

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int searcher_C(lua_State *L)

{
  int iVar1;
  char *name_00;
  char *filename_00;
  char *filename;
  char *name;
  lua_State *L_local;
  
  name_00 = luaL_checklstring(L,1,(size_t *)0x0);
  filename_00 = findfile(L,name_00,"cpath","/");
  if (filename_00 == (char *)0x0) {
    L_local._4_4_ = 1;
  }
  else {
    iVar1 = loadfunc(L,filename_00,name_00);
    L_local._4_4_ = checkload(L,(uint)(iVar1 == 0),filename_00);
  }
  return L_local._4_4_;
}

Assistant:

static int searcher_C (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  const char *filename = findfile(L, name, "cpath", LUA_CSUBSEP);
  if (filename == NULL) return 1;  /* module not found in this path */
  return checkload(L, (loadfunc(L, filename, name) == 0), filename);
}